

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O1

Matrix3x3 * __thiscall CMU462::Matrix3x3::operator-(Matrix3x3 *this)

{
  Matrix3x3 *B;
  Matrix3x3 *in_RDI;
  
  in_RDI->entries[2].x = 0.0;
  in_RDI->entries[2].y = 0.0;
  in_RDI->entries[1].y = 0.0;
  in_RDI->entries[1].z = 0.0;
  in_RDI->entries[0].z = 0.0;
  in_RDI->entries[1].x = 0.0;
  in_RDI->entries[0].x = 0.0;
  in_RDI->entries[0].y = 0.0;
  in_RDI->entries[2].z = 0.0;
  in_RDI->entries[0].x = -this->entries[0].x;
  in_RDI->entries[1].x = -this->entries[1].x;
  in_RDI->entries[2].x = -this->entries[2].x;
  in_RDI->entries[0].y = -this->entries[0].y;
  in_RDI->entries[1].y = -this->entries[1].y;
  in_RDI->entries[2].y = -this->entries[2].y;
  in_RDI->entries[0].z = -this->entries[0].z;
  in_RDI->entries[1].z = -this->entries[1].z;
  in_RDI->entries[2].z = -this->entries[2].z;
  return in_RDI;
}

Assistant:

Matrix3x3 Matrix3x3::operator-( void ) const {

   // returns -A
    const Matrix3x3& A( *this );
    Matrix3x3 B;

    B(0,0) = -A(0,0); B(0,1) = -A(0,1); B(0,2) = -A(0,2);
    B(1,0) = -A(1,0); B(1,1) = -A(1,1); B(1,2) = -A(1,2);
    B(2,0) = -A(2,0); B(2,1) = -A(2,1); B(2,2) = -A(2,2);

    return B;
  }